

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_monitor.c
# Opt level: O0

GLFWvidmode * vidmodeFromModeInfo(XRRModeInfo *mi,XRRCrtcInfo *ci)

{
  int iVar1;
  long in_RDX;
  XRRModeInfo *in_RSI;
  GLFWvidmode *in_RDI;
  
  if ((*(short *)(in_RDX + 0x20) == 2) || (*(short *)(in_RDX + 0x20) == 8)) {
    in_RDI->width = in_RSI->height;
    in_RDI->height = in_RSI->width;
  }
  else {
    in_RDI->width = in_RSI->width;
    in_RDI->height = in_RSI->height;
  }
  iVar1 = calculateRefreshRate(in_RSI);
  in_RDI->refreshRate = iVar1;
  _glfwSplitBPP(*(int *)(*(long *)(_glfw.x11.display + 0xe8) + (long)_glfw.x11.screen * 0x80 + 0x38)
                ,&in_RDI->redBits,&in_RDI->greenBits,&in_RDI->blueBits);
  return in_RDI;
}

Assistant:

static GLFWvidmode vidmodeFromModeInfo(const XRRModeInfo* mi,
                                       const XRRCrtcInfo* ci)
{
    GLFWvidmode mode;

    if (ci->rotation == RR_Rotate_90 || ci->rotation == RR_Rotate_270)
    {
        mode.width  = mi->height;
        mode.height = mi->width;
    }
    else
    {
        mode.width  = mi->width;
        mode.height = mi->height;
    }

    mode.refreshRate = calculateRefreshRate(mi);

    _glfwSplitBPP(DefaultDepth(_glfw.x11.display, _glfw.x11.screen),
                  &mode.redBits, &mode.greenBits, &mode.blueBits);

    return mode;
}